

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::verifySingleColored
          (anon_unknown_0 *this,TestLog *log,ConstPixelBufferAccess *result,Vec4 *refColor)

{
  uint width;
  anon_unknown_0 *this_00;
  bool bVar1;
  ConstPixelBufferAccess *__n;
  Surface *pSVar2;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int px;
  uint y;
  int __fd;
  uint z;
  bool bVar3;
  allocator<char> local_240;
  allocator<char> local_23f;
  allocator<char> local_23e;
  allocator<char> local_23d;
  uint local_23c;
  ConstPixelBufferAccess *local_238;
  Surface errorMask;
  string local_218;
  anon_unknown_0 *local_1f8;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  Surface ideal;
  LogImage local_178;
  LogImage local_e8;
  PixelBufferAccess idealAccess;
  
  width = *(uint *)&log[1].m_log;
  local_238 = (ConstPixelBufferAccess *)log;
  tcu::Surface::Surface(&ideal,width,width);
  tcu::Surface::getAccess(&idealAccess,&ideal);
  tcu::Surface::Surface(&errorMask,width,width);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_178,&errorMask);
  local_218._M_dataplus._M_p._0_4_ = 0xff00ff00;
  tcu::RGBA::toVec((RGBA *)&local_218);
  tcu::clear((PixelBufferAccess *)&local_178,(Vec4 *)&local_e8);
  local_1f8 = this;
  tcu::clear(&idealAccess,(Vec4 *)result);
  z = 0;
  local_23c = 0;
  if (0 < (int)width) {
    local_23c = width;
  }
  bVar3 = true;
  for (; z != local_23c; z = z + 1) {
    for (y = 0; width != y; y = y + 1) {
      refColor = (Vec4 *)(ulong)z;
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&local_178,(int)local_238,y,z)
      ;
      bVar1 = tcu::Vector<float,_4>::operator!=
                        ((Vector<float,_4> *)&local_178,(Vector<float,_4> *)result);
      if (bVar1) {
        *(undefined4 *)((long)errorMask.m_pixels.m_ptr + (long)(int)(errorMask.m_width * z + y) * 4)
             = 0xff0000ff;
        bVar3 = false;
        refColor = (Vec4 *)errorMask.m_pixels.m_ptr;
      }
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"VerifyResult",&local_23d)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"Verification result",&local_23e);
  this_00 = local_1f8;
  tcu::LogImageSet::LogImageSet((LogImageSet *)&local_e8,&local_218,&local_1b0);
  __fd = (int)this_00;
  tcu::LogImageSet::write((LogImageSet *)&local_e8,__fd,__buf,(size_t)refColor);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"Rendered",&local_23f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"Rendered image",&local_240);
  __n = local_238;
  tcu::LogImage::LogImage(&local_178,&local_1d0,&local_1f0,local_238,QP_IMAGE_COMPRESSION_MODE_BEST)
  ;
  tcu::LogImage::write(&local_178,__fd,__buf_00,(size_t)__n);
  tcu::LogImage::~LogImage(&local_178);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_e8);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_218);
  if (!bVar3) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"Reference",&local_23d);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"Ideal reference image",&local_23e);
    pSVar2 = &ideal;
    tcu::LogImage::LogImage(&local_178,&local_218,&local_1b0,pSVar2,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_178,__fd,__buf_01,(size_t)pSVar2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"ErrorMask",&local_23f);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"Error mask",&local_240)
    ;
    pSVar2 = &errorMask;
    tcu::LogImage::LogImage(&local_e8,&local_1d0,&local_1f0,pSVar2,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_e8,__fd,__buf_02,(size_t)pSVar2);
    tcu::LogImage::~LogImage(&local_e8);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1d0);
    tcu::LogImage::~LogImage(&local_178);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_218);
  }
  tcu::TestLog::endImageSet((TestLog *)this_00);
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&ideal);
  return bVar3;
}

Assistant:

static bool verifySingleColored (TestLog& log, const ConstPixelBufferAccess& result, const Vec4& refColor)
{
	const int					width			= result.getWidth();
	const int					height			= result.getWidth();
	tcu::Surface				ideal			(width, height);
	const PixelBufferAccess		idealAccess		= ideal.getAccess();
	tcu::Surface				errorMask		(width, height);
	bool						success			= true;

	tcu::clear(errorMask.getAccess(), tcu::RGBA::green().toVec());
	tcu::clear(idealAccess, refColor);

	for (int py = 0; py < height; py++)
	for (int px = 0; px < width; px++)
	{
		if (result.getPixel(px, py) != refColor)
		{
			errorMask.setPixel(px, py, tcu::RGBA::red());
			success = false;
		}
	}

	log << TestLog::ImageSet("VerifyResult", "Verification result")
		<< TestLog::Image("Rendered", "Rendered image", result);

	if (!success)
	{
		log << TestLog::Image("Reference", "Ideal reference image", ideal)
			<< TestLog::Image("ErrorMask", "Error mask", errorMask);
	}

	log << TestLog::EndImageSet;

	return success;
}